

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

WalletTx * __thiscall
wallet::anon_unknown_5::WalletImpl::getWalletTxDetails
          (WalletTx *__return_storage_ptr__,WalletImpl *this,uint256 *txid,WalletTxStatus *tx_status
          ,WalletOrderForm *order_form,bool *in_mempool,int *num_blocks)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *this_00;
  int iVar2;
  bool bVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  WalletTxStatus local_60;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mapWallet)._M_h,txid);
  if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    p_Var1 = &(__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header;
    memset(__return_storage_ptr__,0,0xe8);
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->is_coinbase = false;
  }
  else {
    iVar2 = ((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_last_block_processed_height;
    if (iVar2 < 0) {
      __assert_fail("m_last_block_processed_height >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
    }
    *num_blocks = iVar2;
    this_00 = (CWalletTx *)
              ((long)iVar4.
                     super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                     _M_cur + 0x28);
    bVar3 = CWalletTx::InMempool(this_00);
    *in_mempool = bVar3;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)order_form,
                (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x58));
    MakeWalletTxStatus(&local_60,
                       (this->m_wallet).
                       super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       this_00);
    tx_status->lock_time = local_60.lock_time;
    tx_status->is_trusted = local_60.is_trusted;
    tx_status->is_abandoned = local_60.is_abandoned;
    tx_status->is_coinbase = local_60.is_coinbase;
    tx_status->is_in_main_chain = local_60.is_in_main_chain;
    tx_status->block_height = local_60.block_height;
    tx_status->blocks_to_maturity = local_60.blocks_to_maturity;
    tx_status->depth_in_main_chain = local_60.depth_in_main_chain;
    tx_status->time_received = local_60.time_received;
    MakeWalletTx(__return_storage_ptr__,
                 (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this_00);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletTx getWalletTxDetails(const uint256& txid,
        WalletTxStatus& tx_status,
        WalletOrderForm& order_form,
        bool& in_mempool,
        int& num_blocks) override
    {
        LOCK(m_wallet->cs_wallet);
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi != m_wallet->mapWallet.end()) {
            num_blocks = m_wallet->GetLastBlockHeight();
            in_mempool = mi->second.InMempool();
            order_form = mi->second.vOrderForm;
            tx_status = MakeWalletTxStatus(*m_wallet, mi->second);
            return MakeWalletTx(*m_wallet, mi->second);
        }
        return {};
    }